

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

char * __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  char *pcVar1;
  char *ret;
  size_t count_local;
  Stack<rapidjson::CrtAllocator> *this_local;
  
  if (this->stackTop_ == (char *)0x0) {
    __assert_fail("stackTop_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                  ,0x82,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                 );
  }
  if ((long)count <= (long)this->stackEnd_ - (long)this->stackTop_) {
    pcVar1 = this->stackTop_;
    this->stackTop_ = this->stackTop_ + count;
    return pcVar1;
  }
  __assert_fail("static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x83,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

RAPIDJSON_FORCEINLINE T* PushUnsafe(size_t count = 1) {
        RAPIDJSON_ASSERT(stackTop_);
        RAPIDJSON_ASSERT(static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_));
        T* ret = reinterpret_cast<T*>(stackTop_);
        stackTop_ += sizeof(T) * count;
        return ret;
    }